

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

_Bool rlFramebufferComplete(uint id)

{
  GLenum GVar1;
  char *text;
  
  (*glad_glBindFramebuffer)(0x8d40,id);
  GVar1 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cdd) {
    text = "FBO: [ID %i] Framebuffer is unsupported";
  }
  else if (GVar1 == 0x8cd7) {
    text = "FBO: [ID %i] Framebuffer has a missing attachment";
  }
  else {
    if (GVar1 != 0x8cd6) goto LAB_0011abec;
    text = "FBO: [ID %i] Framebuffer has incomplete attachment";
  }
  TraceLog(4,text,(ulong)id);
LAB_0011abec:
  (*glad_glBindFramebuffer)(0x8d40,0);
  return GVar1 == 0x8cd5;
}

Assistant:

bool rlFramebufferComplete(unsigned int id)
{
    bool result = false;

#if (defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)) && defined(RLGL_RENDER_TEXTURES_HINT)
    glBindFramebuffer(GL_FRAMEBUFFER, id);

    GLenum status = glCheckFramebufferStatus(GL_FRAMEBUFFER);

    if (status != GL_FRAMEBUFFER_COMPLETE)
    {
        switch (status)
        {
            case GL_FRAMEBUFFER_UNSUPPORTED: TRACELOG(RL_LOG_WARNING, "FBO: [ID %i] Framebuffer is unsupported", id); break;
            case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT: TRACELOG(RL_LOG_WARNING, "FBO: [ID %i] Framebuffer has incomplete attachment", id); break;
#if defined(GRAPHICS_API_OPENGL_ES2)
            case GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS: TRACELOG(RL_LOG_WARNING, "FBO: [ID %i] Framebuffer has incomplete dimensions", id); break;
#endif
            case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT: TRACELOG(RL_LOG_WARNING, "FBO: [ID %i] Framebuffer has a missing attachment", id); break;
            default: break;
        }
    }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    result = (status == GL_FRAMEBUFFER_COMPLETE);
#endif

    return result;
}